

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternClipboard.cpp
# Opt level: O3

void __thiscall PatternClipboard::PatternClipboard(PatternClipboard *this,QObject *parent)

{
  void **ppvVar1;
  undefined4 *puVar2;
  QObject local_48 [8];
  code *local_40;
  ImplFn local_38;
  code *local_30;
  undefined8 local_28;
  
  QObject::QObject(&this->super_QObject,parent);
  *(undefined ***)this = &PTR_metaObject_001fa128;
  (this->mClip).super__Optional_base<PatternClip,_false,_false>._M_payload.
  super__Optional_payload<PatternClip,_true,_false,_false>.super__Optional_payload_base<PatternClip>
  ._M_engaged = false;
  this->mSettingClipboard = false;
  ppvVar1 = (void **)QGuiApplication::clipboard();
  local_30 = QClipboard::dataChanged;
  local_28 = 0;
  local_40 = parseClipboard;
  local_38 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::QSlotObject<void_(PatternClipboard::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar2 + 4) = parseClipboard;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_48,ppvVar1,(QObject *)&local_30,(void **)this,(QSlotObjectBase *)&local_40,
             (ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  parseClipboard(this);
  return;
}

Assistant:

PatternClipboard::PatternClipboard(QObject *parent) :
    QObject(parent),
    mClip(),
    mSettingClipboard(false)
{
    auto clipboard = QGuiApplication::clipboard();
    connect(clipboard, &QClipboard::dataChanged, this, &PatternClipboard::parseClipboard);
    parseClipboard();
}